

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cpp
# Opt level: O0

void __thiscall Epoll::epoll_add(Epoll *this,SP_Channel *request,int timeout)

{
  int iVar1;
  element_type *peVar2;
  __uint32_t *p_Var3;
  int in_EDX;
  Channel *in_RSI;
  __shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2> *in_RDI;
  epoll_event event;
  int fd;
  int in_stack_00000fb4;
  shared_ptr<Channel> *in_stack_00000fb8;
  Epoll *in_stack_00000fc0;
  shared_ptr<Channel> *in_stack_ffffffffffffff88;
  Channel *this_00;
  epoll_event local_54 [2];
  shared_ptr<Channel> local_28;
  int local_18;
  int local_14;
  
  this_00 = in_RSI;
  local_14 = in_EDX;
  peVar2 = std::__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x106273);
  local_18 = Channel::getFd(peVar2);
  if (0 < local_14) {
    in_stack_ffffffffffffff88 = &local_28;
    std::shared_ptr<Channel>::shared_ptr((shared_ptr<Channel> *)in_RSI,in_stack_ffffffffffffff88);
    add_time(in_stack_00000fc0,in_stack_00000fb8,in_stack_00000fb4);
    std::shared_ptr<Channel>::~shared_ptr((shared_ptr<Channel> *)0x1062bb);
    std::__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1062c5);
    Channel::getHolder(this_00);
    std::shared_ptr<HttpData>::operator=
              ((shared_ptr<HttpData> *)in_RSI,(shared_ptr<HttpData> *)in_stack_ffffffffffffff88);
    std::shared_ptr<HttpData>::~shared_ptr((shared_ptr<HttpData> *)0x1062fe);
  }
  local_54[0]._4_4_ = local_18;
  peVar2 = std::__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x10632f);
  p_Var3 = Channel::getEvents(peVar2);
  local_54[0].events = *p_Var3;
  peVar2 = std::__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x106347);
  Channel::EqualAndUpdateLastEvents(peVar2);
  std::shared_ptr<Channel>::operator=((shared_ptr<Channel> *)in_RSI,in_stack_ffffffffffffff88);
  iVar1 = epoll_ctl(*(int *)&in_RDI->_M_ptr,1,local_18,local_54);
  if (iVar1 < 0) {
    perror("epoll_add error");
    std::__shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>::reset(in_RDI);
  }
  return;
}

Assistant:

void Epoll::epoll_add(SP_Channel request, int timeout){
    int fd = request->getFd();
    if(timeout>0){
        add_time(request, timeout);
        fd2http_[fd] = request->getHolder();
    }
    struct epoll_event event;
    event.data.fd=fd;
    event.events=request->getEvents();

    request->EqualAndUpdateLastEvents();

    fd2chan_[fd] = request;
    if(epoll_ctl(epollFd_, EPOLL_CTL_ADD, fd, &event)<0){
        perror("epoll_add error");
        fd2chan_[fd].reset();
    }
}